

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_distributions.cc
# Opt level: O1

void continuous_dist_test_chi2_test<trng::logistic_dist<long_double>>(logistic_dist<long_double> *d)

{
  undefined1 x [16];
  pointer __s;
  ulong uVar1;
  pointer plVar2;
  lcg64_shift *extraout_RDX;
  lcg64_shift *r;
  lcg64_shift *extraout_RDX_00;
  long lVar3;
  int i;
  int iVar4;
  logistic_dist<long_double> *this;
  int i_1;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar5;
  parameter_type P;
  vector<int,_std::allocator<int>_> count;
  vector<long_double,_std::allocator<long_double>_> quantil;
  vector<double,_std::allocator<double>_> p;
  AssertionHandler catchAssertionHandler;
  lcg64_shift R;
  undefined6 in_stack_fffffffffffffec2;
  vector<int,_std::allocator<int>_> local_128;
  vector<long_double,_std::allocator<long_double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  double local_c8;
  AssertionHandler local_b8;
  StringRef local_70;
  undefined1 local_60 [24];
  StringRef local_48;
  SourceLineInfo local_38;
  
  local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_start = (longdouble *)0x0;
  local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (longdouble *)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  __s = (pointer)operator_new(0x200);
  this = (logistic_dist<long_double> *)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       __s;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = __s;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __s + 0x80;
  memset(__s,0,0x200);
  iVar4 = 1;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = __s + 0x80;
  do {
    x._10_6_ = in_stack_fffffffffffffec2;
    x._0_10_ = (longdouble)iVar4 * (longdouble)0.0078125;
    trng::logistic_dist<long_double>::icdf((result_type_conflict3 *)d,this,(result_type_conflict3)x)
    ;
    if (local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      this = (logistic_dist<long_double> *)
             local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_finish;
      lVar5 = in_ST6;
      std::vector<long_double,_std::allocator<long_double>_>::_M_realloc_insert<long_double>
                (&local_108,
                 (iterator)
                 local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                 super__Vector_impl_data._M_finish,(longdouble *)&local_b8);
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      in_ST6 = lVar5;
    }
    else {
      *local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
       super__Vector_impl_data._M_finish = in_ST0;
      this = (logistic_dist<long_double> *)
             (local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
              super__Vector_impl_data._M_finish + 1);
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
      local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)this;
    }
    iVar4 = iVar4 + 1;
  } while (iVar4 != 0x80);
  P.b = 1;
  P.a = 0xfbd19fbbc5c07ff5;
  trng::lcg64_shift::lcg64_shift((lcg64_shift *)local_60,P);
  iVar4 = 0;
  r = extraout_RDX;
  do {
    trng::logistic_dist<long_double>::operator()
              ((result_type_conflict3 *)d,(logistic_dist<long_double> *)local_60,r);
    uVar1 = 0;
    plVar2 = local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      if (in_ST0 <= *plVar2) goto LAB_00248a79;
      uVar1 = uVar1 + 1;
      plVar2 = plVar2 + 1;
    } while (uVar1 != 0x7f);
    uVar1 = 0x7f;
LAB_00248a79:
    __s[uVar1 & 0xffffffff] = __s[uVar1 & 0xffffffff] + 1;
    iVar4 = iVar4 + 1;
    r = extraout_RDX_00;
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    if (iVar4 == 10000) {
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)operator_new(0x400);
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start + 0x80;
      lVar3 = 0;
      do {
        local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[lVar3] = 0.0078125;
        (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start + lVar3)[1] = 0.0078125;
        lVar3 = lVar3 + 2;
      } while (lVar3 != 0x80);
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_c8 = chi_percentil(&local_e8,&local_128);
      local_70.m_start = "REQUIRE";
      local_70.m_size = 7;
      local_38.file =
           "/workspace/llm4binary/github/license_c_cmakelists/rabauke[P]trng4/tests/test_distributions.cc"
      ;
      local_38.line = 0xc2;
      Catch::StringRef::StringRef(&local_48,"(0.01 < c2_p and c2_p < 0.99)");
      Catch::AssertionHandler::AssertionHandler(&local_b8,&local_70,&local_38,local_48,Normal);
      local_70.m_start =
           (char *)(CONCAT71(local_70.m_start._1_7_,-(local_c8 < 0.99) & -(0.01 < local_c8)) &
                   0xffffffffffffff01);
      Catch::AssertionHandler::handleExpr<bool>(&local_b8,(ExprLhs<bool> *)&local_70);
      Catch::AssertionHandler::complete(&local_b8);
      if (local_b8.m_completed == false) {
        (*(local_b8.m_resultCapture)->_vptr_IResultCapture[0xe])();
      }
      if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
          super__Vector_impl_data._M_start != (longdouble *)0x0) {
        operator_delete(local_108.super__Vector_base<long_double,_std::allocator<long_double>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void continuous_dist_test_chi2_test(dist &d) {
  using result_type = typename dist::result_type;
  const int bins{128};
  const result_type dp{result_type(1) / result_type(bins)};
  const int N{10000};
  std::vector<result_type> quantil;
  std::vector<int> count(bins, 0);
  for (int i{1}; i < bins; ++i)
    quantil.push_back(d.icdf(dp * i));
  trng::lcg64_shift R;
  for (int i{0}; i < N; ++i) {
    const result_type x{d(R)};
    int bin{0};
    while (bin < bins - 1 and x > quantil[bin])
      ++bin;
    ++count[bin];
  }
  const std::vector<double> p(bins, 1.0 / bins);
  const double c2_p{chi_percentil(p, count)};
  REQUIRE((0.01 < c2_p and c2_p < 0.99));
}